

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_2> __thiscall
tcu::refract<double,2>(tcu *this,Vector<double,_2> *i,Vector<double,_2> *n,double eta)

{
  double dVar1;
  double dVar2;
  Vector<double,_2> VVar3;
  Vector<double,_2> local_38;
  Vector<double,_2> local_28;
  
  dVar1 = dot<double,2>(n,i);
  dVar2 = 1.0 - eta * eta * (1.0 - dVar1 * dVar1);
  if (0.0 <= dVar2) {
    operator*(eta,i);
    if (dVar2 < 0.0) {
      dVar2 = ::sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    operator*(eta * dVar1 + dVar2,n);
    VVar3 = operator-(&local_38,&local_28);
  }
  else {
    VVar3.m_data = (double  [2])ZEXT816(0);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  VVar3.m_data[0] = VVar3.m_data[0];
  VVar3.m_data[1] = VVar3.m_data[1];
  return (Vector<double,_2>)VVar3.m_data;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}